

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

int __thiscall cmCPackGenerator::PrepareGroupingKind(cmCPackGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  string local_790 [32];
  undefined1 local_770 [8];
  ostringstream cmCPackLog_msg_3;
  char *method_names [3];
  string local_5d8 [32];
  undefined1 local_5b8 [8];
  ostringstream cmCPackLog_msg_2;
  string local_440 [32];
  undefined1 local_420 [8];
  ostringstream cmCPackLog_msg_1;
  string local_2a8 [32];
  undefined1 local_288 [8];
  ostringstream cmCPackLog_msg;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  string groupingType;
  string local_98;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  ComponentPackageMethod local_14;
  cmCPackGenerator *pcStack_10;
  ComponentPackageMethod method;
  cmCPackGenerator *this_local;
  
  local_14 = UNKNOWN_COMPONENT_PACKAGE_METHOD;
  pcStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"CPACK_COMPONENTS_ALL_IN_ONE_PACKAGE",&local_39);
  pcVar3 = GetOption(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (pcVar3 != (char *)0x0) {
    local_14 = ONE_PACKAGE;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"CPACK_COMPONENTS_IGNORE_GROUPS",&local_71);
  pcVar3 = GetOption(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if (pcVar3 != (char *)0x0) {
    local_14 = ONE_PACKAGE_PER_COMPONENT;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_98,"CPACK_COMPONENTS_ONE_PACKAGE_PER_GROUP",
             (allocator *)(groupingType.field_2._M_local_buf + 0xf));
  pcVar3 = GetOption(this,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)(groupingType.field_2._M_local_buf + 0xf));
  if (pcVar3 != (char *)0x0) {
    local_14 = ONE_PACKAGE_PER_GROUP;
  }
  std::__cxx11::string::string((string *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"CPACK_COMPONENTS_GROUPING",&local_e1);
  pcVar3 = GetOption(this,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  if (pcVar3 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"CPACK_COMPONENTS_GROUPING",&local_109);
    pcVar3 = GetOption(this,&local_108);
    std::__cxx11::string::operator=((string *)local_c0,pcVar3);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
    poVar5 = std::operator<<((ostream *)local_288,"[");
    poVar5 = std::operator<<(poVar5,(string *)&this->Name);
    poVar5 = std::operator<<(poVar5,"]");
    poVar5 = std::operator<<(poVar5," requested component grouping = ");
    poVar5 = std::operator<<(poVar5,(string *)local_c0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,2,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x55b,pcVar3);
    std::__cxx11::string::~string(local_2a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_c0,"ALL_COMPONENTS_IN_ONE");
    if (bVar2) {
      local_14 = ONE_PACKAGE;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_c0,"IGNORE");
      if (bVar2) {
        local_14 = ONE_PACKAGE_PER_COMPONENT;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_c0,"ONE_PER_GROUP");
        if (bVar2) {
          local_14 = ONE_PACKAGE_PER_GROUP;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_420);
          poVar5 = std::operator<<((ostream *)local_420,"[");
          poVar5 = std::operator<<(poVar5,(string *)&this->Name);
          poVar5 = std::operator<<(poVar5,"]");
          poVar5 = std::operator<<(poVar5," requested component grouping type <");
          poVar5 = std::operator<<(poVar5,(string *)local_c0);
          poVar5 = std::operator<<(poVar5,
                                   "> UNKNOWN not in (ALL_COMPONENTS_IN_ONE,IGNORE,ONE_PER_GROUP)");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = this->Logger;
          std::__cxx11::ostringstream::str();
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmCPackLog::Log(pcVar1,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                          ,0x56e,pcVar3);
          std::__cxx11::string::~string(local_440);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_420);
        }
      }
    }
  }
  if (((local_14 == ONE_PACKAGE_PER_GROUP) &&
      (bVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponentGroup>_>_>
               ::empty(&this->ComponentGroups), bVar2)) &&
     (bVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
              ::empty(&this->Components), !bVar2)) {
    local_14 = (ComponentPackageMethod)(this->componentPackageMethod != ONE_PACKAGE);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    poVar5 = std::operator<<((ostream *)local_5b8,"[");
    poVar5 = std::operator<<(poVar5,(string *)&this->Name);
    poVar5 = std::operator<<(poVar5,"]");
    poVar5 = std::operator<<(poVar5," One package per component group requested, ");
    poVar5 = std::operator<<(poVar5,"but NO component groups exist: Ignoring component group.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Logger;
    std::__cxx11::ostringstream::str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x583,pcVar3);
    std::__cxx11::string::~string(local_5d8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
  }
  if (local_14 != UNKNOWN_COMPONENT_PACKAGE_METHOD) {
    this->componentPackageMethod = local_14;
  }
  method_names[0] = "IGNORE_GROUPS";
  method_names[1] = "ONE_PER_GROUP";
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_770);
  poVar5 = std::operator<<((ostream *)local_770,"[");
  poVar5 = std::operator<<(poVar5,(string *)&this->Name);
  poVar5 = std::operator<<(poVar5,"]");
  poVar5 = std::operator<<(poVar5," requested component grouping = ");
  poVar5 = std::operator<<(poVar5,method_names[(ulong)this->componentPackageMethod - 1]);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  pcVar1 = this->Logger;
  std::__cxx11::ostringstream::str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0x597,pcVar3);
  std::__cxx11::string::~string(local_790);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_770);
  std::__cxx11::string::~string((string *)local_c0);
  return 1;
}

Assistant:

int cmCPackGenerator::PrepareGroupingKind()
{
  // find a component package method specified by the user
  ComponentPackageMethod method = UNKNOWN_COMPONENT_PACKAGE_METHOD;

  if(this->GetOption("CPACK_COMPONENTS_ALL_IN_ONE_PACKAGE"))
    {
    method = ONE_PACKAGE;
    }

  if(this->GetOption("CPACK_COMPONENTS_IGNORE_GROUPS"))
    {
    method = ONE_PACKAGE_PER_COMPONENT;
    }

  if(this->GetOption("CPACK_COMPONENTS_ONE_PACKAGE_PER_GROUP"))
    {
    method = ONE_PACKAGE_PER_GROUP;
    }

  std::string groupingType;

  // Second way to specify grouping
  if (NULL != this->GetOption("CPACK_COMPONENTS_GROUPING")) {
     groupingType = this->GetOption("CPACK_COMPONENTS_GROUPING");
  }

  if (!groupingType.empty())
    {
    cmCPackLogger(cmCPackLog::LOG_VERBOSE,  "["
        << this->Name << "]"
        << " requested component grouping = "<< groupingType <<std::endl);
    if (groupingType == "ALL_COMPONENTS_IN_ONE")
      {
      method = ONE_PACKAGE;
      }
    else if (groupingType == "IGNORE")
      {
      method = ONE_PACKAGE_PER_COMPONENT;
      }
    else if (groupingType == "ONE_PER_GROUP")
      {
      method = ONE_PACKAGE_PER_GROUP;
      }
    else
      {
      cmCPackLogger(cmCPackLog::LOG_WARNING, "["
          << this->Name << "]"
          << " requested component grouping type <"<< groupingType
          << "> UNKNOWN not in (ALL_COMPONENTS_IN_ONE,IGNORE,ONE_PER_GROUP)"
          << std::endl);
      }
    }

  // Some components were defined but NO group
  // fallback to default if not group based
  if(method == ONE_PACKAGE_PER_GROUP &&
     this->ComponentGroups.empty() && !this->Components.empty())
    {
    if(componentPackageMethod == ONE_PACKAGE)
      {
      method = ONE_PACKAGE;
      }
    else
      {
      method = ONE_PACKAGE_PER_COMPONENT;
      }
    cmCPackLogger(cmCPackLog::LOG_WARNING, "["
         << this->Name << "]"
         << " One package per component group requested, "
         << "but NO component groups exist: Ignoring component group."
         << std::endl);
    }

  // if user specified packaging method, override the default packaging method
  if(method != UNKNOWN_COMPONENT_PACKAGE_METHOD)
    {
    componentPackageMethod = method;
    }

  const char* method_names[] =
    {
    "ALL_COMPONENTS_IN_ONE",
    "IGNORE_GROUPS",
    "ONE_PER_GROUP"
    };

  cmCPackLogger(cmCPackLog::LOG_VERBOSE,  "["
        << this->Name << "]"
        << " requested component grouping = "
        << method_names[componentPackageMethod]
        << std::endl);

  return 1;
}